

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_base64.c
# Opt level: O0

void * uo_base64url_decode(void *dst,char *src,size_t src_len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  byte *pbVar6;
  uchar a3;
  uchar a2;
  uchar a1;
  uchar a0;
  uchar *end;
  uchar *a;
  uchar *b;
  size_t src_len_local;
  char *src_local;
  void *dst_local;
  
  end = (uchar *)src;
  a = (uchar *)dst;
  while (end + 4 <= src + src_len) {
    bVar1 = *end;
    bVar2 = atob_url[end[1]];
    pbVar6 = end + 3;
    bVar3 = atob_url[end[2]];
    end = end + 4;
    bVar4 = atob_url[*pbVar6];
    *a = atob_url[bVar1] << 2 | (byte)((int)(uint)bVar2 >> 4);
    pbVar6 = a + 2;
    a[1] = bVar2 << 4 | (byte)((int)(uint)bVar3 >> 2);
    a = a + 3;
    *pbVar6 = bVar3 << 6 | bVar4;
  }
  lVar5 = (long)(src + src_len) - (long)end;
  if (lVar5 == 2) {
    *a = atob_url[*end] << 2 | (byte)((int)(uint)atob_url[end[1]] >> 4);
    a = a + 1;
  }
  else if (lVar5 == 3) {
    bVar1 = atob_url[end[1]];
    bVar2 = atob_url[end[2]];
    *a = atob_url[*end] << 2 | (byte)((int)(uint)bVar1 >> 4);
    a[1] = bVar1 << 4 | (byte)((int)(uint)bVar2 >> 2);
    a = a + 2;
  }
  return a;
}

Assistant:

void *uo_base64url_decode(
    void *dst,
    const char *src,
    size_t src_len)
{
    unsigned char *b = (unsigned char *)dst;
    const unsigned char *a = (unsigned char *)src;
    const unsigned char *end = a + src_len;
    unsigned char a0, a1, a2, a3;

    while (a + 4 <= end)
    {
        a0 = atob_url[*a++];
        a1 = atob_url[*a++];
        a2 = atob_url[*a++];
        a3 = atob_url[*a++];

        *b++ = a0 << 2 | a1 >> 4;
        *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
        *b++ = (a2 & 0x03) << 6 | a3;
    }

    switch (end - a)
    {
        case 3:
            a0 = atob_url[*a++];
            a1 = atob_url[*a++];
            a2 = atob_url[*a++];

            *b++ = a0 << 2 | a1 >> 4;
            *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
            break;

        case 2:
            a0 = atob_url[*a++];
            a1 = atob_url[*a++];

            *b++ = a0 << 2 | a1 >> 4;
            break;
    }

    return b;
}